

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

int write_uniform_cost(int n,int v)

{
  int in_ESI;
  int in_EDI;
  int m;
  int l;
  undefined4 local_4;
  
  local_4 = get_unsigned_bits(0);
  if (local_4 == 0) {
    local_4 = 0;
  }
  else if (in_ESI < (1 << ((byte)local_4 & 0x1f)) - in_EDI) {
    local_4 = (local_4 + -1) * 0x200;
  }
  else {
    local_4 = local_4 << 9;
  }
  return local_4;
}

Assistant:

static inline int write_uniform_cost(int n, int v) {
  const int l = get_unsigned_bits(n);
  const int m = (1 << l) - n;
  if (l == 0) return 0;
  if (v < m)
    return av1_cost_literal(l - 1);
  else
    return av1_cost_literal(l);
}